

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O3

void __thiscall
NshHistoryAddEntry_SuccessWhenOverriding_Test::TestBody
          (NshHistoryAddEntry_SuccessWhenOverriding_Test *this)

{
  int iVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  char *pcVar3;
  char entry_override [10];
  char new_entry [10];
  nsh_history_t hist;
  AssertHelper local_870;
  internal local_868 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_860;
  AssertHelper local_858;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_850;
  undefined2 local_848;
  char local_840 [12];
  nsh_history_t local_834;
  
  nsh_history_reset(&local_834);
  builtin_strncpy(local_840,"new_entry",10);
  iVar1 = 0x10;
  do {
    nsh_history_add_entry(&local_834,local_840);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  local_850._M_head_impl._0_4_ = 0x10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_868,"hist.size","16u",&local_834.size,(uint *)&local_850);
  if (local_868[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_850);
    if (local_860 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_860->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_870,(Message *)&local_850);
LAB_0011b6c3:
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    _Var2._M_head_impl = local_850._M_head_impl;
  }
  else {
    if (local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_860,local_860);
    }
    local_850._M_head_impl = local_850._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              (local_868,"hist.head","0",&local_834.head,(int *)&local_850);
    if (local_868[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_850);
      if (local_860 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_860->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_870,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                 ,0x3a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_870,(Message *)&local_850);
      goto LAB_0011b6c3;
    }
    if (local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_860,local_860);
    }
    local_850._M_head_impl = local_850._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              (local_868,"hist.tail","0",&local_834.tail,(int *)&local_850);
    if (local_868[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_850);
      if (local_860 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_860->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_870,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                 ,0x3b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_870,(Message *)&local_850);
      goto LAB_0011b6c3;
    }
    if (local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_860,local_860);
    }
    local_850._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x656469727265766f;
    local_848 = 0x6e;
    nsh_history_add_entry(&local_834,(char *)&local_850);
    local_870.data_._0_4_ = 0x10;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_868,"hist.size","16u",&local_834.size,(uint *)&local_870);
    if (local_868[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_870);
      if (local_860 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_860->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_858,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                 ,0x40,pcVar3);
      testing::internal::AssertHelper::operator=(&local_858,(Message *)&local_870);
    }
    else {
      if (local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_860,local_860);
      }
      local_870.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                (local_868,"hist.head","1",&local_834.head,(int *)&local_870);
      if (local_868[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_870);
        if (local_860 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_860->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_858,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                   ,0x41,pcVar3);
        testing::internal::AssertHelper::operator=(&local_858,(Message *)&local_870);
      }
      else {
        if (local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_860,local_860);
        }
        local_870.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  (local_868,"hist.tail","1",&local_834.tail,(int *)&local_870);
        if (local_868[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_870);
          if (local_860 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_860->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_858,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                     ,0x42,pcVar3);
          testing::internal::AssertHelper::operator=(&local_858,(Message *)&local_870);
        }
        else {
          if (local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_860,local_860);
          }
          testing::internal::CmpHelperSTREQ
                    (local_868,"hist.entries[0]","entry_override",(char *)&local_834,
                     (char *)&local_850);
          if (local_868[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_870);
            if (local_860 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = (local_860->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_858,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                       ,0x43,pcVar3);
            testing::internal::AssertHelper::operator=(&local_858,(Message *)&local_870);
          }
          else {
            if (local_860 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_860,local_860);
            }
            testing::internal::CmpHelperSTREQ
                      (local_868,"hist.entries[1]","new_entry",local_834.entries[1],local_840);
            if (local_868[0] != (internal)0x0) goto LAB_0011b6dd;
            testing::Message::Message((Message *)&local_870);
            if (local_860 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = (local_860->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_858,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
                       ,0x44,pcVar3);
            testing::internal::AssertHelper::operator=(&local_858,(Message *)&local_870);
          }
        }
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_858);
    _Var2._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_870.data_._4_4_,local_870.data_._0_4_);
  }
  if (_Var2._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var2._M_head_impl + 8))();
  }
LAB_0011b6dd:
  if (local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_860,local_860);
  }
  return;
}

Assistant:

TEST(NshHistoryAddEntry, SuccessWhenOverriding)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    ASSERT_EQ(hist.size, NSH_CMD_HISTORY_SIZE);
    ASSERT_EQ(hist.head, 0);
    ASSERT_EQ(hist.tail, 0);

    const char entry_override[] = "overriden";
    nsh_history_add_entry(&hist, entry_override);

    ASSERT_EQ(hist.size, NSH_CMD_HISTORY_SIZE);
    ASSERT_EQ(hist.head, 1);
    ASSERT_EQ(hist.tail, 1);
    ASSERT_STREQ(hist.entries[0], entry_override);
    ASSERT_STREQ(hist.entries[1], new_entry);
}